

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O1

bool testMethod_erase(void)

{
  int iVar1;
  String *this;
  ostream *poVar2;
  bool bVar3;
  String str;
  String SStack_28;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testMethod_erase()\n",0x13);
  cm::String::String<char_const(&)[8],void>(&SStack_28,(char (*) [8])"abcdefg");
  this = cm::String::erase(&SStack_28,5,0xffffffffffffffff);
  cm::String::erase(this,1,2);
  if (SStack_28.view_._M_len == 3) {
    iVar1 = strncmp(SStack_28.view_._M_str,"ade",3);
    if (iVar1 == 0) {
      bVar3 = true;
      goto LAB_00188418;
    }
    iVar1 = 0x29b;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(std::strncmp(str.data(), \"ade\", 3) == 0) failed on line ",0x44);
  }
  else {
    iVar1 = 0x29a;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.size() == 3) failed on line ",0x2c);
  }
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  bVar3 = false;
LAB_00188418:
  if (SStack_28.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (SStack_28.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar3;
}

Assistant:

static bool testMethod_front_back()
{
  std::cout << "testMethod_front_back()\n";
  cm::String str = "abc";
  ASSERT_TRUE(str.front() == 'a');
  ASSERT_TRUE(str.back() == 'c');
  return true;
}